

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O1

void xb_zgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long local_70;
  long local_68;
  long local_58;
  long local_50;
  
  iVar1 = *M;
  iVar2 = *N;
  iVar9 = *K;
  if (iVar1 <= *p_ldc && (0 < iVar9 && (0 < iVar2 && 0 < iVar1))) {
    iVar3 = *p_lda;
    iVar11 = *p_ldb;
    iVar14 = iVar9;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      iVar14 = iVar1;
    }
    if (iVar14 <= iVar3) {
      iVar14 = iVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        iVar14 = iVar9;
      }
      if (iVar14 <= iVar11) {
        dVar19 = *alpha;
        if (((((dVar19 != 0.0) || (NAN(dVar19))) || (*(double *)((long)alpha + 8) != 0.0)) ||
            ((NAN(*(double *)((long)alpha + 8)) || (*beta != 1.0)))) ||
           ((NAN(*beta) ||
            ((*(double *)((long)beta + 8) != 0.0 || (NAN(*(double *)((long)beta + 8)))))))) {
          if ((byte)(*transa | 0x20U) == 0x6e) {
            lVar15 = (long)iVar3 * 2;
            local_68 = 2;
          }
          else {
            local_68 = (long)(iVar3 * 2);
            lVar15 = 2;
          }
          if ((byte)(*transb | 0x20U) == 0x6e) {
            local_70 = (long)iVar11 * 2;
            lVar17 = 2;
          }
          else {
            lVar17 = (long)(iVar11 * 2);
            local_70 = 2;
          }
          iVar3 = *p_ldc * 2;
          if ((((dVar19 != 0.0) || (NAN(dVar19))) || (*(double *)((long)alpha + 8) != 0.0)) ||
             (NAN(*(double *)((long)alpha + 8)))) {
            if (((dVar19 != 1.0) || (NAN(dVar19))) ||
               ((*(double *)((long)alpha + 8) != 0.0 || (NAN(*(double *)((long)alpha + 8)))))) {
              if (0 < iVar1) {
                pdVar10 = (double *)((long)a + 8);
                local_50 = 0;
                iVar11 = 0;
                do {
                  if (0 < iVar2) {
                    iVar14 = 0;
                    lVar18 = local_50;
                    pdVar8 = (double *)((long)b + 8);
                    do {
                      if (iVar9 < 1) {
                        dVar19 = 0.0;
                        dVar20 = 0.0;
                      }
                      else {
                        dVar19 = 0.0;
                        dVar20 = 0.0;
                        pdVar13 = pdVar10;
                        pdVar16 = pdVar8;
                        iVar12 = iVar9;
                        do {
                          dVar21 = *pdVar13;
                          if ((byte)(*transa | 0x20U) == 99) {
                            dVar21 = -dVar21;
                          }
                          dVar22 = *pdVar16;
                          if ((byte)(*transb | 0x20U) == 99) {
                            dVar22 = -dVar22;
                          }
                          dVar19 = dVar19 + pdVar16[-1] * pdVar13[-1] + -dVar21 * dVar22;
                          dVar20 = dVar20 + dVar22 * pdVar13[-1] + dVar21 * pdVar16[-1];
                          pdVar16 = pdVar16 + lVar17;
                          pdVar13 = pdVar13 + lVar15;
                          iVar12 = iVar12 + -1;
                        } while (iVar12 != 0);
                      }
                      dVar21 = *(double *)((long)c + lVar18 * 8);
                      dVar22 = *(double *)((long)c + lVar18 * 8 + 8);
                      dVar4 = *alpha;
                      dVar5 = *(double *)((long)alpha + 8);
                      dVar6 = *beta;
                      dVar7 = *(double *)((long)beta + 8);
                      pdVar13 = (double *)((long)c + lVar18 * 8);
                      *pdVar13 = dVar21 * dVar6 + dVar7 * -dVar22 + dVar19 * dVar4 + dVar5 * -dVar20
                      ;
                      pdVar13[1] = dVar21 * dVar7 + dVar6 * dVar22 + dVar19 * dVar5 + dVar4 * dVar20
                      ;
                      iVar14 = iVar14 + 1;
                      lVar18 = lVar18 + iVar3;
                      pdVar8 = pdVar8 + local_70;
                    } while (iVar14 != iVar2);
                  }
                  iVar11 = iVar11 + 1;
                  local_50 = local_50 + 2;
                  pdVar10 = pdVar10 + local_68;
                } while (iVar11 != iVar1);
              }
            }
            else if (((*beta != 0.0) || (NAN(*beta))) ||
                    ((*(double *)((long)beta + 8) != 0.0 || (NAN(*(double *)((long)beta + 8)))))) {
              if (0 < iVar1) {
                pdVar10 = (double *)((long)a + 8);
                local_50 = 0;
                iVar11 = 0;
                do {
                  if (0 < iVar2) {
                    iVar14 = 0;
                    pdVar8 = (double *)((long)b + 8);
                    lVar18 = local_50;
                    do {
                      if (iVar9 < 1) {
                        dVar19 = 0.0;
                        dVar20 = 0.0;
                      }
                      else {
                        dVar19 = 0.0;
                        dVar20 = 0.0;
                        pdVar13 = pdVar8;
                        pdVar16 = pdVar10;
                        iVar12 = iVar9;
                        do {
                          dVar21 = *pdVar16;
                          if ((byte)(*transa | 0x20U) == 99) {
                            dVar21 = -dVar21;
                          }
                          dVar22 = *pdVar13;
                          if ((byte)(*transb | 0x20U) == 99) {
                            dVar22 = -dVar22;
                          }
                          dVar19 = dVar19 + pdVar13[-1] * pdVar16[-1] + -dVar21 * dVar22;
                          dVar20 = dVar20 + dVar22 * pdVar16[-1] + dVar21 * pdVar13[-1];
                          pdVar13 = pdVar13 + lVar17;
                          pdVar16 = pdVar16 + lVar15;
                          iVar12 = iVar12 + -1;
                        } while (iVar12 != 0);
                      }
                      dVar21 = *(double *)((long)c + lVar18 * 8);
                      dVar22 = *(double *)((long)c + lVar18 * 8 + 8);
                      dVar4 = *beta;
                      dVar5 = *(double *)((long)beta + 8);
                      pdVar13 = (double *)((long)c + lVar18 * 8);
                      *pdVar13 = dVar21 * dVar4 + dVar5 * -dVar22 + dVar19;
                      pdVar13[1] = dVar21 * dVar5 + dVar4 * dVar22 + dVar20;
                      iVar14 = iVar14 + 1;
                      lVar18 = lVar18 + iVar3;
                      pdVar8 = pdVar8 + local_70;
                    } while (iVar14 != iVar2);
                  }
                  iVar11 = iVar11 + 1;
                  local_50 = local_50 + 2;
                  pdVar10 = pdVar10 + local_68;
                } while (iVar11 != iVar1);
              }
            }
            else if (0 < iVar1) {
              pdVar10 = (double *)((long)a + 8);
              local_58 = 0;
              iVar11 = 0;
              do {
                if (0 < iVar2) {
                  iVar14 = 0;
                  pdVar8 = (double *)((long)b + 8);
                  lVar18 = local_58;
                  do {
                    if (iVar9 < 1) {
                      dVar19 = 0.0;
                      dVar20 = 0.0;
                    }
                    else {
                      dVar19 = 0.0;
                      dVar20 = 0.0;
                      pdVar13 = pdVar8;
                      pdVar16 = pdVar10;
                      iVar12 = iVar9;
                      do {
                        dVar21 = *pdVar16;
                        if ((byte)(*transa | 0x20U) == 99) {
                          dVar21 = -dVar21;
                        }
                        dVar22 = *pdVar13;
                        if ((byte)(*transb | 0x20U) == 99) {
                          dVar22 = -dVar22;
                        }
                        dVar19 = dVar19 + pdVar13[-1] * pdVar16[-1] + -dVar21 * dVar22;
                        dVar20 = dVar20 + dVar22 * pdVar16[-1] + dVar21 * pdVar13[-1];
                        pdVar13 = pdVar13 + lVar17;
                        pdVar16 = pdVar16 + lVar15;
                        iVar12 = iVar12 + -1;
                      } while (iVar12 != 0);
                    }
                    pdVar13 = (double *)((long)c + lVar18 * 8);
                    *pdVar13 = dVar19;
                    pdVar13[1] = dVar20;
                    iVar14 = iVar14 + 1;
                    lVar18 = lVar18 + iVar3;
                    pdVar8 = pdVar8 + local_70;
                  } while (iVar14 != iVar2);
                }
                iVar11 = iVar11 + 1;
                local_58 = local_58 + 2;
                pdVar10 = pdVar10 + local_68;
              } while (iVar11 != iVar1);
            }
          }
          else if (0 < iVar1) {
            iVar9 = 0;
            do {
              pdVar10 = (double *)c;
              iVar11 = iVar2;
              if (0 < iVar2) {
                do {
                  dVar19 = *pdVar10;
                  dVar20 = *beta;
                  dVar21 = *(double *)((long)beta + 8);
                  *pdVar10 = dVar19 * dVar20 + dVar21 * -pdVar10[1];
                  pdVar10[1] = dVar19 * dVar21 + dVar20 * pdVar10[1];
                  iVar11 = iVar11 + -1;
                  pdVar10 = pdVar10 + iVar3;
                } while (iVar11 != 0);
              }
              iVar9 = iVar9 + 1;
              c = (void *)((long)c + 0x10);
            } while (iVar9 != iVar1);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_zgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const double *a_i = (double *) a;
    const double *b_i = (double *) b;

    /* Output Matrix */
    double *c_i = (double *) c;

    /* Input Scalars */
    double *alpha_i = (double *) alpha;
    double *beta_i = (double *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    double a_elem[2];
    double b_elem[2];
    double c_elem[2];
    double prod[2];
    double sum[2];
    double tmp1[2];
    double tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (double) c_elem[0] * beta_i[0] -
			    (double) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (double) c_elem[0] * beta_i[1] +
			    (double) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (double) a_elem[0] * b_elem[0] -
			    (double) a_elem[1] * b_elem[1];
			prod[1] =
			    (double) a_elem[0] * b_elem[1] +
			    (double) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(double) sum[0] * alpha_i[0] -
			(double) sum[1] * alpha_i[1];
		    tmp1[1] =
			(double) sum[0] * alpha_i[1] +
			(double) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}